

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
units::shortStringReplacement_abi_cxx11_(string *__return_storage_ptr__,units *this,char U)

{
  initializer_list<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  char cVar1;
  bool bVar2;
  int iVar3;
  pointer pvVar4;
  undefined7 in_register_00000011;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5f0;
  allocator local_5c9;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_5c8;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_5c0;
  const_iterator res;
  char local_5b0 [47];
  char local_581;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_580;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_528;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_500;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_488;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  iterator local_28;
  size_type local_20;
  char local_11 [8];
  char U_local;
  
  local_11[0] = (char)this;
  unique0x10000ada = __return_storage_ptr__;
  if ((shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&shortStringReplacement[abi:cxx11](char)::
                                   singleCharUnitStrings_abi_cxx11_,this,
                                  CONCAT71(in_register_00000011,U)), iVar3 != 0)) {
    local_580 = &local_578;
    local_581 = 'm';
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,&local_581,(char (*) [6])0x1de389);
    local_580 = &local_550;
    local_5b0[0x1b] = 0x73;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(local_580,local_5b0 + 0x1b,(char (*) [7])0x1d9f87);
    local_580 = &local_528;
    local_5b0[0x1a] = 0x53;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[8],_true>(local_580,local_5b0 + 0x1a,(char (*) [8])"siemens");
    local_580 = &local_500;
    local_5b0[0x19] = 0x6c;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 0x19,(char (*) [6])0x1d9300);
    local_580 = &local_4d8;
    local_5b0[0x18] = 0x67;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(local_580,local_5b0 + 0x18,(char (*) [5])0x1dab6f);
    local_580 = &local_4b0;
    local_5b0[0x17] = 0x62;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(local_580,local_5b0 + 0x17,(char (*) [5])"barn");
    local_580 = &local_488;
    local_5b0[0x16] = 0x72;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[12],_true>(local_580,local_5b0 + 0x16,(char (*) [12])"revolutions");
    local_580 = &local_460;
    local_5b0[0x15] = 0x56;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(local_580,local_5b0 + 0x15,(char (*) [5])0x1daeea);
    local_580 = &local_438;
    local_5b0[0x14] = 0x46;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 0x14,(char (*) [6])0x1d9b33);
    local_580 = &local_410;
    local_5b0[0x13] = 0x79;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(local_580,local_5b0 + 0x13,(char (*) [5])0x1da095);
    local_580 = &local_3e8;
    local_5b0[0x12] = 0x70;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 0x12,(char (*) [6])"poise");
    local_580 = &local_3c0;
    local_5b0[0x11] = 0x4b;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(local_580,local_5b0 + 0x11,(char (*) [7])0x1d9aa5);
    local_580 = &local_398;
    local_5b0[0x10] = 0x61;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>(local_580,local_5b0 + 0x10,(char (*) [4])0x1da6b0);
    local_580 = &local_370;
    local_5b0[0xf] = 0x4e;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(local_580,local_5b0 + 0xf,(char (*) [7])"newton");
    local_580 = &local_348;
    local_5b0[0xe] = 100;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>(local_580,local_5b0 + 0xe,(char (*) [4])0x1d9123);
    local_580 = &local_320;
    local_5b0[0xd] = 0x42;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(local_580,local_5b0 + 0xd,(char (*) [5])"byte");
    local_580 = &local_2f8;
    local_5b0[0xc] = 0x58;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[3],_true>(local_580,local_5b0 + 0xc,(char (*) [3])"xu");
    local_580 = &local_2d0;
    local_5b0[0xb] = 0x54;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 0xb,(char (*) [6])"tesla");
    local_580 = &local_2a8;
    local_5b0[10] = 0x55;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 10,(char (*) [6])0x1db0bc);
    local_580 = &local_280;
    local_5b0[9] = 0x4d;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 9,(char (*) [6])"molar");
    local_580 = &local_258;
    local_5b0[8] = 0x50;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 8,(char (*) [6])"poise");
    local_580 = &local_230;
    local_5b0[7] = 0x57;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(local_580,local_5b0 + 7,(char (*) [5])0x1da6d3);
    local_580 = &local_208;
    local_5b0[6] = 0x41;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(local_580,local_5b0 + 6,(char (*) [7])"ampere");
    local_580 = &local_1e0;
    local_5b0[5] = 0x43;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[8],_true>(local_580,local_5b0 + 5,(char (*) [8])0x1da524);
    local_580 = &local_1b8;
    local_5b0[4] = 0x4a;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 4,(char (*) [6])"joule");
    local_580 = &local_190;
    local_5b0[3] = 0x48;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 3,(char (*) [6])0x1d9bc7);
    local_580 = &local_168;
    local_5b0[2] = 0x47;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(local_580,local_5b0 + 2,(char (*) [6])"gauss");
    local_580 = &local_140;
    local_5b0[1] = 0x68;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(local_580,local_5b0 + 1,(char (*) [5])0x1dc730);
    local_580 = &local_118;
    local_5b0[0] = 'D';
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>(local_580,local_5b0,(char (*) [4])0x1d9123);
    local_580 = &local_f0;
    res.
    super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_cur._7_1_ = 0x6f;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>
              (local_580,
               (char *)((long)&res.
                               super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 7),(char (*) [7])"arcdeg");
    local_580 = &local_c8;
    res.
    super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_cur._6_1_ = 0x4c;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>
              (local_580,
               (char *)((long)&res.
                               super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 6),(char (*) [7])"liter ");
    local_580 = &local_a0;
    res.
    super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_cur._5_1_ = 0x57;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (local_580,
               (char *)((long)&res.
                               super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 5),(char (*) [5])0x1da6d3);
    local_580 = &local_78;
    res.
    super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_cur._4_1_ = 0x65;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[17],_true>
              (local_580,
               (char *)((long)&res.
                               super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 4),(char (*) [17])"elementarycharge");
    local_580 = &local_50;
    res.
    super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_cur._3_1_ = 0x74;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (local_580,
               (char *)((long)&res.
                               super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 3),(char (*) [6])0x1dc63e);
    local_28 = &local_578;
    local_20 = 0x22;
    std::
    allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&res);
    __l._M_len = local_20;
    __l._M_array = local_28;
    std::
    unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map(&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_,__l,0
                    ,(hasher *)
                     ((long)&res.
                             super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 2),
                    (key_equal *)
                    ((long)&res.
                            super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur + 1),
                    (allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&res);
    std::
    allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&res);
    local_5f0 = (pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_28;
    do {
      local_5f0 = local_5f0 + -1;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_5f0);
    } while (local_5f0 != &local_578);
    __cxa_atexit(std::
                 unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~unordered_map,
                 &shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_);
  }
  local_5c0._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_,local_11);
  local_5c8._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_);
  bVar2 = std::__detail::operator==(&local_5c0,&local_5c8);
  cVar1 = local_11[0];
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,1,cVar1,&local_5c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  }
  else {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)&local_5c0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pvVar4->second);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string shortStringReplacement(char U)
{
    // LCOV_EXCL_START
    // not sure why this isn't showing up as covered
    static const std::unordered_map<char, std::string> singleCharUnitStrings{
        {'m', "meter"},       {'s', "second"}, {'S', "siemens"},
        {'l', "liter"},       {'g', "gram"},   {'b', "barn"},
        {'r', "revolutions"}, {'V', "volt"},   {'F', "farad"},
        {'y', "year"},        {'p', "poise"},  {'K', "kelvin"},
        {'a', "are"},         {'N', "newton"}, {'d', "day"},
        {'B', "byte"},        {'X', "xu"},     {'T', "tesla"},
        {'U', "units"},       {'M', "molar"},  {'P', "poise"},
        {'W', "watt"},        {'A', "ampere"}, {'C', "coulomb"},
        {'J', "joule"},       {'H', "henry"},  {'G', "gauss"},
        {'h', "hour"},        {'D', "day"},    {'o', "arcdeg"},
        {'L', "liter "},      {'W', "watt"},   {'e', "elementarycharge"},
        {'t', "tonne"}};

    // LCOV_EXCL_STOP

    auto res = singleCharUnitStrings.find(U);
    return (res == singleCharUnitStrings.end()) ? std::string(1, U) :
                                                  res->second;
}